

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  cmake *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmListFileFunction *pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  pointer pcVar9;
  const_iterator __begin2;
  pointer filename;
  pointer pcVar10;
  bool bVar11;
  string local_230;
  cmListFileFunction *local_210;
  string temp;
  string local_1e8;
  string local_1c8;
  ostringstream msg;
  size_t local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  local_210 = lff;
  GetExecutionFilePath_abi_cxx11_(&local_230,this);
  cmsys::SystemTools::GetFilenameName(&local_1e8,&local_230);
  filename = (pcVar1->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pcVar1->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (filename == pbVar2) {
LAB_00223dd4:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&msg,local_230._M_dataplus._M_p,local_230._M_string_length);
    pcVar4 = local_210;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"):  ",4);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&msg,
                        (pcVar4->super_cmCommandContext).Name.Original._M_dataplus._M_p,
                        (pcVar4->super_cmCommandContext).Name.Original._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
    bVar11 = this->GlobalGenerator->CMakeInstance->TraceExpand;
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    pcVar10 = (pcVar4->Arguments).
              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar3 = (pcVar4->Arguments).
             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar10 != pcVar3) {
      do {
        pcVar9 = pcVar10;
        if (bVar11 != false) {
          std::__cxx11::string::_M_assign((string *)&temp);
          ExpandVariablesInString(this,&temp,false,false,false,(char *)0x0,-1,false,false);
          pcVar9 = (pointer)&temp;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&msg,(pcVar9->Value)._M_dataplus._M_p,(pcVar9->Value)._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg," ",1);
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != pcVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,")",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&local_1c8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp._M_dataplus._M_p != &temp.field_2) {
      operator_delete(temp._M_dataplus._M_p,
                      CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0]
                              ) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    std::ios_base::~ios_base(local_138);
  }
  else {
    do {
      lVar7 = std::__cxx11::string::rfind
                        ((char *)&local_230,(ulong)(filename->_M_dataplus)._M_p,0xffffffffffffffff);
      if ((lVar7 != -1) && (lVar7 + filename->_M_string_length == local_230._M_string_length)) {
        cmsys::SystemTools::GetFilenameName((string *)&msg,filename);
        _Var5._M_p = _msg;
        if (local_1e8._M_string_length == local_1a0) {
          if (local_1e8._M_string_length == 0) {
            bVar11 = true;
          }
          else {
            iVar6 = bcmp(local_1e8._M_dataplus._M_p,_msg,local_1e8._M_string_length);
            bVar11 = iVar6 == 0;
          }
        }
        else {
          bVar11 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != local_198) {
          operator_delete(_Var5._M_p,local_198[0]._M_allocated_capacity + 1);
        }
        if (bVar11) goto LAB_00223dd4;
      }
      filename = filename + 1;
    } while (filename != pbVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name.Original << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (cmListFileArgument const& arg : lff.Arguments) {
    if (expand) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << arg.Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str());
}